

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedlist.h
# Opt level: O2

void __thiscall
TWeightedList<FDecalBase_*>::AddEntry
          (TWeightedList<FDecalBase_*> *this,FDecalBase *value,WORD weight)

{
  Choice<FDecalBase_*> *pCVar1;
  Choice<FDecalBase_*> *pCVar2;
  undefined2 in_register_00000012;
  Choice<FDecalBase_*> *pCVar3;
  
  pCVar1 = (Choice<FDecalBase_*> *)this;
  if (CONCAT22(in_register_00000012,weight) == 0) {
    return;
  }
  do {
    pCVar3 = pCVar1;
    pCVar1 = pCVar3->Next;
    if (pCVar1 == (Choice<FDecalBase_*> *)0x0) break;
  } while (pCVar1->Weight < weight);
  pCVar2 = (Choice<FDecalBase_*> *)operator_new(0x18);
  pCVar2->Weight = weight;
  pCVar2->RandomVal = '\0';
  pCVar2->Value = value;
  pCVar3->Next = pCVar2;
  pCVar2->Next = pCVar1;
  RecalcRandomVals(this);
  return;
}

Assistant:

void TWeightedList<T>::AddEntry (T value, WORD weight)
{
	if (weight == 0)
	{ // If the weight is 0, don't bother adding it,
	  // since it will never be chosen.
		return;
	}

	Choice<T> **insAfter = &Choices, *insBefore = Choices;
	Choice<T> *theNewOne;

	while (insBefore != NULL && insBefore->Weight < weight)
	{
		insAfter = &insBefore->Next;
		insBefore = insBefore->Next;
	}
	theNewOne = new Choice<T> (weight, value);
	*insAfter = theNewOne;
	theNewOne->Next = insBefore;
	RecalcRandomVals ();
}